

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ucum.cpp
# Opt level: O1

void __thiscall UCUM_TestRoundTrip2_Test::~UCUM_TestRoundTrip2_Test(UCUM_TestRoundTrip2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UCUM, TestRoundTrip2)
{
    std::ifstream i(TEST_FILE_FOLDER "/example_ucum_codes.csv");
    std::string line;
    int ciFail = 0;
    int ceqFail = 0;
    while (std::getline(i, line)) {
        auto fc = line.find_first_of(',');
        auto fc2 = line.find_first_of(',', fc + 1);
        auto ustring = line.substr(fc + 1, fc2 - fc - 1);
        auto name = line.substr(fc2 + 1);
        auto csact = units::unit_from_string(ustring, units::strict_ucum);
        std::string genstring = to_string(csact);
        auto uact = units::unit_from_string(genstring, units::strict_ucum);

        if (is_error(uact)) {
            std::cout << ustring << "->" << genstring
                      << " does not result in a valid ustring unit for " << name
                      << '\n';

            ++ciFail;
            // units::unit_from_string(ustring);
            // to_string(csact);
        }

        if (uact != csact) {
            std::cout << genstring << " and " << ustring
                      << " do not produce the same unit " << name << '\n';
            ++ceqFail;
        }
    }
    if (ceqFail > 0) {
        std::cout << ceqFail
                  << "test unit name mismatches between unit and description\n";
    }
    EXPECT_EQ(ceqFail, 0);
    EXPECT_EQ(ciFail, 0);
}